

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-opt.cpp
# Opt level: O0

void ggml_opt_result_loss(ggml_opt_result_t result,double *loss,double *unc)

{
  bool bVar1;
  reference pfVar2;
  double *in_RDX;
  double *in_RSI;
  long in_RDI;
  double dVar3;
  double var_sum;
  double mean;
  float loss_scaled;
  float *loss_1;
  iterator __end1;
  iterator __begin1;
  vector<float,_std::allocator<float>_> *__range1;
  double sum_squared;
  double sum;
  int64_t nbatches;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff78;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *in_stack_ffffffffffffff80
  ;
  double local_78;
  float local_6c;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_40;
  long local_38;
  double local_30;
  double local_28;
  size_type local_20;
  double *local_18;
  double *local_10;
  long local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20 = std::vector<float,_std::allocator<float>_>::size
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 8));
  if (local_20 == 0) {
    *local_10 = 0.0;
    *local_18 = NAN;
  }
  else {
    local_28 = 0.0;
    local_30 = 0.0;
    local_38 = local_8 + 8;
    local_40._M_current =
         (float *)std::vector<float,_std::allocator<float>_>::begin(in_stack_ffffffffffffff78);
    std::vector<float,_std::allocator<float>_>::end(in_stack_ffffffffffffff78);
    while (bVar1 = __gnu_cxx::operator!=
                             (in_stack_ffffffffffffff80,
                              (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                               *)in_stack_ffffffffffffff78), bVar1) {
      pfVar2 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
               operator*(&local_40);
      if ((*(byte *)(local_8 + 0x48) & 1) == 0) {
        local_6c = *pfVar2;
      }
      else {
        local_6c = *pfVar2 * (float)*(long *)(local_8 + 0x40);
      }
      local_28 = (double)local_6c + local_28;
      local_30 = (double)(local_6c * local_6c) + local_30;
      __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::operator++
                (&local_40);
    }
    dVar3 = local_28 / (double)(long)local_20;
    local_78 = dVar3;
    if ((*(byte *)(local_8 + 0x48) & 1) == 0) {
      local_78 = local_28;
    }
    *local_10 = local_78;
    if (local_18 != (double *)0x0) {
      if ((long)local_20 < 2) {
        *local_18 = NAN;
      }
      else {
        dVar3 = -dVar3 * dVar3 + local_30 / (double)(long)local_20;
        if ((*(byte *)(local_8 + 0x48) & 1) == 0) {
          dVar3 = sqrt((dVar3 * (double)(long)local_20) / (double)(long)(local_20 - 1));
        }
        else {
          dVar3 = sqrt(dVar3 / (double)(long)(local_20 - 1));
        }
        *local_18 = dVar3;
      }
    }
  }
  return;
}

Assistant:

void ggml_opt_result_loss(ggml_opt_result_t result, double * loss, double * unc) {
    const int64_t nbatches = result->loss.size(); // Number of physical batches.

    if (nbatches == 0) {
        *loss = 0.0;
        *unc  = NAN;
        return;
    }

    double sum         = 0.0;
    double sum_squared = 0.0;

    for (const float & loss : result->loss) {
        // If the loss is per datapoint it was scaled by 1.0f/opt_period for each physical batch.
        const float loss_scaled = result->loss_per_datapoint ? loss*result->opt_period : loss;
        sum         += loss_scaled;
        sum_squared += loss_scaled*loss_scaled;
    }

    const double mean = sum/nbatches;
    *loss = result->loss_per_datapoint ? mean : sum;

    if (!unc) {
        return;
    }

    if (nbatches < 2) {
        *unc = NAN;
        return;
    }

    const double var_sum = sum_squared/nbatches - mean*mean; // variance without Bessel's correction, i.e. nbatches/(nbatches-1)
    *unc = result->loss_per_datapoint ? sqrt(var_sum / (nbatches - 1)) : sqrt(var_sum * nbatches/(nbatches - 1));
}